

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O0

void __thiscall
cmCTestGlobalVC::DoRevision
          (cmCTestGlobalVC *this,Revision *revision,
          vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes)

{
  cmCTest *this_00;
  undefined8 uVar1;
  __type _Var2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  pointer pCVar7;
  undefined4 extraout_var;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
  *this_01;
  mapped_type *pmVar8;
  Revision *local_2d8;
  File *file;
  string local_270;
  undefined1 local_250 [8];
  string name;
  string local_228;
  undefined1 local_208 [8];
  string dir;
  char *local;
  __normal_iterator<const_cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
  local_1d8;
  const_iterator ci;
  Revision *rev;
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes_local;
  Revision *revision_local;
  cmCTestGlobalVC *this_local;
  
  _Var2 = std::operator==(&revision->Rev,&this->OldRevision);
  if (_Var2) {
    cmCTestVC::Revision::operator=(&this->PriorRev,revision);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar5 = std::operator<<((ostream *)local_198,".");
    std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
    this_00 = (this->super_cmCTestVC).CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestGlobalVC.cxx"
                 ,0x32,pcVar6,false);
    std::__cxx11::string::~string((string *)&rev);
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::__cxx11::list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::push_back
              (&this->Revisions,revision);
    ci._M_current =
         (Change *)
         std::__cxx11::list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::back
                   (&this->Revisions);
    poVar5 = std::operator<<((this->super_cmCTestVC).Log,"Found revision ");
    poVar5 = std::operator<<(poVar5,(string *)ci._M_current);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"  author = ");
    poVar5 = std::operator<<(poVar5,(string *)ci._M_current[1].Path.field_2._M_local_buf);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"  date = ");
    poVar5 = std::operator<<(poVar5,(string *)(((ci._M_current)->Path).field_2._M_local_buf + 8));
    std::operator<<(poVar5,"\n");
    local_1d8._M_current =
         (Change *)
         std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::begin
                   (changes);
    while( true ) {
      local = (char *)std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                      ::end(changes);
      bVar3 = __gnu_cxx::operator!=
                        (&local_1d8,
                         (__normal_iterator<const_cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
                          *)&local);
      if (!bVar3) break;
      pCVar7 = __gnu_cxx::
               __normal_iterator<const_cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
               ::operator->(&local_1d8);
      iVar4 = (*(this->super_cmCTestVC)._vptr_cmCTestVC[7])(this,&pCVar7->Path);
      pcVar6 = (char *)CONCAT44(extraout_var,iVar4);
      dir.field_2._8_8_ = pcVar6;
      if (pcVar6 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_228,pcVar6,(allocator *)(name.field_2._M_local_buf + 0xf));
        cmsys::SystemTools::GetFilenamePath((string *)local_208,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
        uVar1 = dir.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_270,(char *)uVar1,(allocator *)((long)&file + 7));
        cmsys::SystemTools::GetFilenameName((string *)local_250,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator((allocator<char> *)((long)&file + 7));
        this_01 = &std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
                   ::operator[](&this->Dirs,(key_type *)local_208)->
                   super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
        ;
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
                 ::operator[](this_01,(key_type *)local_250);
        if (pmVar8->Rev == (Revision *)0x0) {
          local_2d8 = &this->PriorRev;
        }
        else {
          local_2d8 = pmVar8->Rev;
        }
        pmVar8->PriorRev = local_2d8;
        pmVar8->Rev = (Revision *)ci._M_current;
        poVar5 = std::operator<<((this->super_cmCTestVC).Log,"  ");
        pCVar7 = __gnu_cxx::
                 __normal_iterator<const_cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
                 ::operator->(&local_1d8);
        poVar5 = std::operator<<(poVar5,pCVar7->Action);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,(char *)dir.field_2._8_8_);
        poVar5 = std::operator<<(poVar5," ");
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string((string *)local_250);
        std::__cxx11::string::~string((string *)local_208);
      }
      __gnu_cxx::
      __normal_iterator<const_cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
      ::operator++(&local_1d8);
    }
  }
  return;
}

Assistant:

void cmCTestGlobalVC::DoRevision(Revision const& revision,
                                 std::vector<Change> const& changes)
{
  // Ignore changes in the old revision.
  if(revision.Rev == this->OldRevision)
    {
    this->PriorRev = revision;
    return;
    }

  // Indicate we found a revision.
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "." << std::flush);

  // Store the revision.
  this->Revisions.push_back(revision);

  // Report this revision.
  Revision const& rev = this->Revisions.back();
  this->Log << "Found revision " << rev.Rev << "\n"
            << "  author = " << rev.Author << "\n"
            << "  date = " << rev.Date << "\n";

  // Update information about revisions of the changed files.
  for(std::vector<Change>::const_iterator ci = changes.begin();
      ci != changes.end(); ++ci)
    {
    if(const char* local = this->LocalPath(ci->Path))
      {
      std::string dir = cmSystemTools::GetFilenamePath(local);
      std::string name = cmSystemTools::GetFilenameName(local);
      File& file = this->Dirs[dir][name];
      file.PriorRev = file.Rev? file.Rev : &this->PriorRev;
      file.Rev = &rev;
      this->Log << "  " << ci->Action << " " << local << " " << "\n";
      }
    }
}